

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_finalize(void)

{
  comex_group_t in_stack_000000a4;
  
  if (initialized != 0) {
    initialized = 0;
    comex_barrier(in_stack_000000a4);
    comex_group_finalize();
    free(fence_array);
    MPI_Comm_free(&l_state);
  }
  return 0;
}

Assistant:

int comex_finalize()
{
    /* it's okay to call multiple times -- extra calls are no-ops */
    if (!initialized) {
        return COMEX_SUCCESS;
    }

    initialized = 0;

    /* Make sure that all outstanding operations are done */
    comex_barrier(COMEX_GROUP_WORLD);

    /* groups */
    comex_group_finalize();

    free(fence_array);

    /* destroy the communicators */
    MPI_Comm_free(&l_state.world_comm);

    return COMEX_SUCCESS;
}